

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueBigUInt16::read
          (PLYValueBigUInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  long *plVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  undefined4 in_register_00000034;
  
  plVar1 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar5 = *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x10);
  pbVar4 = *(byte **)(CONCAT44(in_register_00000034,__fd) + 0x18);
  if (pbVar5 < pbVar4) {
    uVar3 = (uint)*pbVar5;
    pbVar5 = pbVar5 + 1;
    plVar1[2] = (long)pbVar5;
  }
  else {
    uVar3 = (**(code **)(*plVar1 + 0x50))(plVar1);
    pbVar5 = (byte *)plVar1[2];
    pbVar4 = (byte *)plVar1[3];
  }
  uVar3 = uVar3 << 8;
  this->value = (unsigned_short)uVar3;
  if (pbVar5 < pbVar4) {
    bVar2 = *pbVar5;
    plVar1[2] = (long)(pbVar5 + 1);
  }
  else {
    bVar2 = (**(code **)(*plVar1 + 0x50))(plVar1);
    uVar3 = (uint)this->value;
  }
  this->value = (unsigned_short)(uVar3 | bVar2);
  return (ulong)(uVar3 | bVar2);
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<unsigned short>((in->sbumpc()&0xff)<<8);
      value|=static_cast<unsigned short>(in->sbumpc()&0xff);
    }